

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O1

bool __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::equals
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,
          QObject<std::complex<float>_> *other)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  long local_40;
  float *local_38;
  long local_30;
  float *local_28;
  
  (*other->_vptr_QObject[7])(&local_40);
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&local_30,this);
  if (local_30 == local_40) {
    bVar5 = local_40 < 1;
    if (0 < local_40) {
      bVar4 = false;
      bVar5 = false;
      if ((*local_28 == *local_38) && (bVar5 = bVar4, !NAN(*local_28) && !NAN(*local_38))) {
        if ((local_28[1] == local_38[1]) && (!NAN(local_28[1]) && !NAN(local_38[1]))) {
          lVar6 = 0;
          bVar5 = false;
          pfVar7 = local_38;
          pfVar8 = local_28;
          do {
            lVar9 = 0;
            while( true ) {
              if (local_40 + -1 == lVar9) goto LAB_0015fa9d;
              lVar1 = lVar9 + 1;
              if ((pfVar8[lVar9 * 2 + 2] != pfVar7[lVar9 * 2 + 2]) ||
                 (NAN(pfVar8[lVar9 * 2 + 2]) || NAN(pfVar7[lVar9 * 2 + 2]))) break;
              lVar2 = lVar9 * 2;
              lVar3 = lVar9 * 2;
              if ((pfVar8[lVar2 + 3] != pfVar7[lVar3 + 3]) ||
                 (lVar9 = lVar1, NAN(pfVar8[lVar2 + 3]) || NAN(pfVar7[lVar3 + 3]))) break;
            }
            if (lVar1 < local_40) break;
LAB_0015fa9d:
            lVar6 = lVar6 + 1;
            bVar5 = local_40 <= lVar6;
            if (lVar6 == local_40) break;
            if ((local_28[lVar6 * local_30 * 2] != local_38[lVar6 * local_40 * 2]) ||
               (NAN(local_28[lVar6 * local_30 * 2]) || NAN(local_38[lVar6 * local_40 * 2]))) break;
            pfVar8 = pfVar8 + local_30 * 2;
            pfVar7 = pfVar7 + local_40 * 2;
            if ((local_28[lVar6 * local_30 * 2 + 1] != local_38[lVar6 * local_40 * 2 + 1]) ||
               (NAN(local_28[lVar6 * local_30 * 2 + 1]) || NAN(local_38[lVar6 * local_40 * 2 + 1])))
            break;
          } while( true );
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  if (local_28 != (float *)0x0) {
    operator_delete__(local_28);
  }
  if (local_38 != (float *)0x0) {
    operator_delete__(local_38);
  }
  return bVar5;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
        return ( other.matrix() == matrix() ) ;
      }